

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::gestureEventHandler(QGraphicsScenePrivate *this,QGestureEvent *event)

{
  const_iterator last;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Int IVar5;
  GestureCancelPolicy GVar6;
  GestureState GVar7;
  QWidget *pQVar8;
  QGraphicsView *pQVar9;
  QGesturePrivate *pQVar10;
  qsizetype qVar11;
  QSet<QGesture_*> *this_00;
  const_reference ppQVar12;
  iterator conflicts;
  const_iterator first;
  QGraphicsObject *pQVar13;
  QGraphicsScenePrivate *pQVar14;
  QGraphicsObject **ppQVar15;
  QGesture **ppQVar16;
  QGestureEvent *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  qreal qVar17;
  QList<QGesture_*> *__range1_3;
  QGesture *g_4;
  add_const_t<QSet<QGesture_*>_> *__range1_2;
  QGraphicsItem *item_2;
  QSet<QGesture_*> *__range2;
  bool isPanel;
  int i_2;
  QGraphicsItemPrivate *d;
  QList<QGesture_*> *__range1_1;
  QSet<QGesture_*> *__range4_2;
  int i_1;
  QSet<QGesture_*> *__range4_1;
  QGesture *g;
  QSet<QGesture_*> *__range4;
  int i;
  QGraphicsObject *target;
  QList<QGesture_*> *__range1;
  QGraphicsView *graphicsView;
  QWidget *viewport;
  QGesture *g_5;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  QGraphicsObject *obj;
  GestureType gestureType;
  QGesture *gesture_2;
  iterator it_1;
  QSet<QGraphicsObject_*> targetsSet;
  QGesture *g_3;
  const_iterator __end2;
  const_iterator __begin2;
  QSet<QGesture_*> ignoredGestures;
  QGestureEvent ev_1;
  QSet<QGesture_*> gestures_2;
  QPointer<QGraphicsObject> receiver;
  GestureFlags flags;
  QGraphicsObject *target_1;
  QGesture *gesture_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  QSet<QGesture_*> parentPropagatedGestures;
  QSet<QGesture_*> undeliveredGestures;
  QGesture *g_2;
  const_iterator __end4_2;
  const_iterator __begin4_2;
  QSet<QGesture_*> gestures_1;
  QGraphicsObject *item_1;
  iterator e;
  iterator it;
  QGesture *g_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  const_iterator __end4;
  const_iterator __begin4;
  QGestureEvent ev;
  QSet<QGesture_*> gestures;
  QPointer<QGraphicsObject> item;
  QSet<QGesture_*> conflictedGestures;
  QSet<QGesture_*> normalGestures;
  QGesture *gesture;
  const_iterator __end1;
  const_iterator __begin1;
  QPoint delta;
  QSet<QGesture_*> startedGestures;
  QList<QGesture_*> allGestures;
  QTransform toScene;
  QGestureEvent *in_stack_fffffffffffff868;
  undefined7 in_stack_fffffffffffff870;
  undefined1 in_stack_fffffffffffff877;
  undefined4 in_stack_fffffffffffff878;
  int in_stack_fffffffffffff87c;
  iterator in_stack_fffffffffffff880;
  iterator in_stack_fffffffffffff888;
  QGraphicsObject *in_stack_fffffffffffff890;
  QGraphicsScenePrivate *in_stack_fffffffffffff898;
  undefined7 in_stack_fffffffffffff8a0;
  undefined1 in_stack_fffffffffffff8a7;
  undefined8 in_stack_fffffffffffff8a8;
  GestureFlag GVar18;
  QSet<QGesture_*> *in_stack_fffffffffffff8b0;
  QGraphicsScenePrivate *in_stack_fffffffffffff8b8;
  QGraphicsScenePrivate *this_01;
  byte local_715;
  QGraphicsScenePrivate *in_stack_fffffffffffff940;
  QGraphicsItem *local_698;
  int local_674;
  QSet<QGesture_*> *in_stack_fffffffffffff990;
  int local_634;
  int local_5f8;
  int local_5f4;
  QGesture *local_5b0;
  QGesture **local_5a8;
  const_iterator local_5a0;
  const_iterator local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  iterator local_548 [3];
  QGraphicsObject *local_518;
  GestureType local_50c;
  QGesture *in_stack_fffffffffffffaf8;
  iterator local_4f0;
  undefined1 *local_4e0;
  undefined8 local_4c8;
  QGesture *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  QGestureEvent local_478;
  QGraphicsObject *local_438;
  QGraphicsObject *local_430;
  QGraphicsObject *local_420;
  undefined1 *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  QFlagsStorageHelper<Qt::GestureFlag,_4> local_3e0;
  undefined1 local_3dc [4];
  GestureType local_3d8;
  QFlagsStorageHelper<Qt::GestureFlag,_4> local_3d4;
  undefined8 local_3b0;
  QGraphicsObject *local_3a8;
  QGesture *local_3a0;
  QGesture **local_398;
  const_iterator local_390;
  const_iterator local_388;
  undefined1 *local_380;
  QSet<QGesture_*> local_378;
  QGesture *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  QGraphicsObject *local_340;
  QGraphicsObject *local_338;
  QGraphicsObject *local_320;
  piter local_318;
  piter local_308;
  Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *local_2f8;
  undefined1 *local_2f0;
  Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *local_2e8;
  undefined1 *local_2e0;
  QGraphicsObject *local_2d8;
  QGesture *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  QGestureEvent local_270;
  QGraphicsObject *local_230;
  undefined1 *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 local_1f0 [8];
  QSet<QGesture_*> local_1e8 [3];
  qsizetype local_1d0;
  QPointF local_1c8;
  QPointF local_1b8;
  qreal local_1a8;
  qreal local_1a0;
  QGesture *local_198;
  QGesture **local_190;
  const_iterator local_188;
  const_iterator local_180 [2];
  QPoint local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  bool local_f8 [80];
  undefined1 local_a8 [80];
  QTransform local_58;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = QGestureEvent::widget(in_RSI);
  if (pQVar8 != (QWidget *)0x0) {
    QObject::parent((QObject *)0x9cfd0e);
    pQVar9 = qobject_cast<QGraphicsView*>((QObject *)0x9cfd16);
    if (pQVar9 != (QGraphicsView *)0x0) {
      local_160 = &DAT_aaaaaaaaaaaaaaaa;
      local_158 = &DAT_aaaaaaaaaaaaaaaa;
      local_150 = &DAT_aaaaaaaaaaaaaaaa;
      QGestureEvent::gestures(in_stack_fffffffffffff868);
      local_168 = &DAT_aaaaaaaaaaaaaaaa;
      QSet<QGesture_*>::QSet((QSet<QGesture_*> *)0x9cfd8c);
      local_170 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      QPoint::QPoint((QPoint *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
      local_170 = QWidget::mapFromGlobal
                            ((QWidget *)in_stack_fffffffffffff880.i,
                             (QPoint *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878)
                            );
      memcpy(&local_58,&DAT_00b45368,0x50);
      iVar3 = QPoint::x((QPoint *)0x9cfdfb);
      iVar4 = QPoint::y((QPoint *)0x9cfe15);
      QTransform::fromTranslate((double)iVar3,(double)iVar4);
      QGraphicsView::viewportTransform((QGraphicsView *)in_stack_fffffffffffff888.i);
      QTransform::inverted(local_f8);
      QTransform::operator*(&local_58,(QTransform *)local_a8);
      local_180[0].i = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
      local_180[0] = QList<QGesture_*>::begin
                               ((QList<QGesture_*> *)
                                CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
      local_188.i = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
      local_188 = QList<QGesture_*>::end
                            ((QList<QGesture_*> *)
                             CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
      while( true ) {
        local_190 = local_188.i;
        bVar1 = QList<QGesture_*>::const_iterator::operator!=(local_180,local_188);
        GVar18 = (GestureFlag)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
        if (!bVar1) break;
        ppQVar16 = QList<QGesture_*>::const_iterator::operator*(local_180);
        local_198 = *ppQVar16;
        bVar1 = QGesture::hasHotSpot((QGesture *)0x9cff37);
        if (bVar1) {
          local_1b8 = QGesture::hotSpot((QGesture *)
                                        CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878
                                                ));
          qVar17 = local_1b8.yp;
          local_1a8 = (qreal)QTransform::map((QPointF *)&local_58);
          local_1a0 = qVar17;
          pQVar10 = QGesture::d_func((QGesture *)0x9cff90);
          (pQVar10->sceneHotSpot).xp = local_1a8;
          (pQVar10->sceneHotSpot).yp = local_1a0;
        }
        else {
          QPointF::QPointF(&local_1c8);
          pQVar10 = QGesture::d_func((QGesture *)0x9cffca);
          (pQVar10->sceneHotSpot).xp = local_1c8.xp;
          (pQVar10->sceneHotSpot).yp = local_1c8.yp;
        }
        local_1d0 = 0;
        pQVar13 = QHash<QGesture_*,_QGraphicsObject_*>::value
                            ((QHash<QGesture_*,_QGraphicsObject_*> *)
                             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
                             (QGesture **)
                             CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                             (QGraphicsObject **)in_stack_fffffffffffff868);
        if ((pQVar13 == (QGraphicsObject *)0x0) &&
           (GVar7 = QGesture::state((QGesture *)0x9d0038), GVar7 == GestureStarted)) {
          QSet<QGesture_*>::insert
                    ((QSet<QGesture_*> *)in_stack_fffffffffffff888.i,
                     (QGesture **)in_stack_fffffffffffff880.i);
        }
        QList<QGesture_*>::const_iterator::operator++(local_180);
      }
      bVar1 = QSet<QGesture_*>::isEmpty((QSet<QGesture_*> *)0x9d007d);
      local_5f8 = in_stack_fffffffffffff87c;
      if (!bVar1) {
        local_1e8[0].q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
        QSet<QGesture_*>::QSet((QSet<QGesture_*> *)0x9d00a1);
        local_1f0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        QSet<QGesture_*>::QSet((QSet<QGesture_*> *)0x9d00bd);
        in_stack_fffffffffffff868 = (QGestureEvent *)local_1f0;
        gestureTargetsAtHotSpots
                  (in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,GVar18,
                   (QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)
                   CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
                   (QSet<QGraphicsObject_*> *)in_stack_fffffffffffff898,
                   (QSet<QGesture_*> *)in_stack_fffffffffffff890,in_stack_fffffffffffff990);
        QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::keys
                  ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)in_stack_fffffffffffff898);
        QList<QGraphicsObject_*>::operator=
                  ((QList<QGraphicsObject_*> *)
                   CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                   (QList<QGraphicsObject_*> *)in_stack_fffffffffffff868);
        QList<QGraphicsObject_*>::~QList((QList<QGraphicsObject_*> *)0x9d013c);
        QList<QGraphicsObject_*>::begin
                  ((QList<QGraphicsObject_*> *)
                   CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
        QList<QGraphicsObject_*>::end
                  ((QList<QGraphicsObject_*> *)
                   CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
        std::
        sort<QList<QGraphicsObject*>::iterator,bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>
                  (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
                   (_func_bool_QGraphicsItem_ptr_QGraphicsItem_ptr *)in_stack_fffffffffffff868);
        bVar1 = QSet<QGesture_*>::isEmpty((QSet<QGesture_*> *)0x9d019d);
        if (!bVar1) {
          for (local_5f4 = 0;
              qVar11 = QList<QGraphicsObject_*>::size((QList<QGraphicsObject_*> *)(in_RDI + 0x338)),
              local_5f4 < qVar11; local_5f4 = local_5f4 + 1) {
            local_218 = &DAT_aaaaaaaaaaaaaaaa;
            local_210 = &DAT_aaaaaaaaaaaaaaaa;
            QList<QGraphicsObject_*>::at
                      ((QList<QGraphicsObject_*> *)
                       CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                       (qsizetype)in_stack_fffffffffffff868);
            QPointer<QGraphicsObject>::QPointer<void>
                      ((QPointer<QGraphicsObject> *)
                       CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                       (QGraphicsObject *)in_stack_fffffffffffff868);
            local_220 = &DAT_aaaaaaaaaaaaaaaa;
            local_230 = QPointer<QGraphicsObject>::data((QPointer<QGraphicsObject> *)0x9d0264);
            QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::value
                      ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)in_stack_fffffffffffff888.i,
                       in_stack_fffffffffffff880.i);
            ::operator&((QSet<QGesture_*> *)in_stack_fffffffffffff888.i,
                        (QSet<QGesture_*> *)in_stack_fffffffffffff880.i);
            QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x9d02b3);
            bVar1 = QSet<QGesture_*>::isEmpty((QSet<QGesture_*> *)0x9d02c0);
            if (bVar1) {
              local_5f8 = 6;
            }
            else {
              memset(&local_270,0xaa,0x40);
              QSet<QGesture_*>::values((QSet<QGesture_*> *)in_stack_fffffffffffff880.i);
              QGestureEvent::QGestureEvent
                        ((QGestureEvent *)
                         CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                         (QList<QGesture_*> *)in_stack_fffffffffffff868);
              QList<QGesture_*>::~QList((QList<QGesture_*> *)0x9d0324);
              local_270._8_2_ = 0xca;
              pQVar8 = QGestureEvent::widget(in_RSI);
              QGestureEvent::setWidget(&local_270,pQVar8);
              QEvent::ignore(&local_270.super_QEvent);
              local_298 = &DAT_aaaaaaaaaaaaaaaa;
              local_290 = &DAT_aaaaaaaaaaaaaaaa;
              QSet<QGesture_*>::begin((QSet<QGesture_*> *)in_stack_fffffffffffff888.i);
              local_2a8 = &DAT_aaaaaaaaaaaaaaaa;
              local_2a0 = &DAT_aaaaaaaaaaaaaaaa;
              QSet<QGesture_*>::end((QSet<QGesture_*> *)in_stack_fffffffffffff888.i);
              while (bVar1 = QSet<QGesture_*>::const_iterator::operator!=
                                       ((const_iterator *)
                                        CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870
                                                ),(const_iterator *)in_stack_fffffffffffff868),
                    bVar1) {
                QSet<QGesture_*>::const_iterator::operator*((const_iterator *)0x9d0408);
                QGestureEvent::setAccepted
                          ((QGestureEvent *)in_stack_fffffffffffff880.i,
                           (QGesture *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878)
                           ,(bool)in_stack_fffffffffffff877);
                QSet<QGesture_*>::const_iterator::operator++
                          ((const_iterator *)
                           CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
              }
              QPointer<QGraphicsObject>::data((QPointer<QGraphicsObject> *)0x9d0446);
              sendEvent(in_stack_fffffffffffff898,(QGraphicsItem *)in_stack_fffffffffffff890,
                        (QEvent *)in_stack_fffffffffffff888.i);
              local_2b8 = &DAT_aaaaaaaaaaaaaaaa;
              local_2b0 = &DAT_aaaaaaaaaaaaaaaa;
              QSet<QGesture_*>::begin((QSet<QGesture_*> *)in_stack_fffffffffffff888.i);
              local_2c8 = &DAT_aaaaaaaaaaaaaaaa;
              local_2c0 = &DAT_aaaaaaaaaaaaaaaa;
              QSet<QGesture_*>::end((QSet<QGesture_*> *)in_stack_fffffffffffff888.i);
              while (bVar1 = QSet<QGesture_*>::const_iterator::operator!=
                                       ((const_iterator *)
                                        CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870
                                                ),(const_iterator *)in_stack_fffffffffffff868),
                    bVar1) {
                ppQVar16 = QSet<QGesture_*>::const_iterator::operator*((const_iterator *)0x9d0545);
                local_2d0 = *ppQVar16;
                bVar1 = QEvent::isAccepted(&local_270.super_QEvent);
                if ((bVar1) ||
                   (bVar1 = QGestureEvent::isAccepted
                                      ((QGestureEvent *)in_stack_fffffffffffff880.i,
                                       (QGesture *)
                                       CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878)
                                      ), bVar1)) {
                  QSet<QGesture_*>::remove((QSet<QGesture_*> *)local_1f0,(char *)&local_2d0);
                  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsObject> *)0x9d05a1);
                  if (bVar1) {
                    local_2d8 = QPointer<QGraphicsObject>::data
                                          ((QPointer<QGraphicsObject> *)0x9d05cd);
                    QHash<QGesture_*,_QGraphicsObject_*>::insert
                              ((QHash<QGesture_*,_QGraphicsObject_*> *)
                               CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                               (QGesture **)in_stack_fffffffffffff868,(QGraphicsObject **)0x9d05f2);
                    local_2e8 = (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)
                                &DAT_aaaaaaaaaaaaaaaa;
                    local_2e0 = &DAT_aaaaaaaaaaaaaaaa;
                    QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::iterator::iterator
                              ((iterator *)0x9d062d);
                    local_2f8 = (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)
                                &DAT_aaaaaaaaaaaaaaaa;
                    local_2f0 = &DAT_aaaaaaaaaaaaaaaa;
                    QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::iterator::iterator
                              ((iterator *)0x9d0658);
                    local_308 = (piter)QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::begin
                                                 ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)
                                                  in_stack_fffffffffffff888.i);
                    local_2e8 = local_308.d;
                    local_2e0 = (undefined1 *)local_308.bucket;
                    local_318 = (piter)QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::end
                                                 ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)
                                                  CONCAT44(in_stack_fffffffffffff87c,
                                                           in_stack_fffffffffffff878));
                    local_2f8 = local_318.d;
                    local_2f0 = (undefined1 *)local_318.bucket;
                    while (bVar1 = QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::iterator::operator!=
                                             ((iterator *)
                                              CONCAT44(in_stack_fffffffffffff87c,
                                                       in_stack_fffffffffffff878),
                                              (iterator *)
                                              CONCAT17(in_stack_fffffffffffff877,
                                                       in_stack_fffffffffffff870)), bVar1) {
                      this_00 = QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::iterator::value
                                          ((iterator *)0x9d0708);
                      QSet<QGesture_*>::remove(this_00,(char *)&local_2d0);
                      QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::iterator::operator++
                                ((iterator *)in_stack_fffffffffffff880.i);
                    }
                    local_320 = QPointer<QGraphicsObject>::data
                                          ((QPointer<QGraphicsObject> *)0x9d074a);
                    QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::operator[]
                              ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)
                               in_stack_fffffffffffff880.i,
                               (QGraphicsObject **)
                               CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
                    QSet<QGesture_*>::insert
                              ((QSet<QGesture_*> *)in_stack_fffffffffffff888.i,
                               (QGesture **)in_stack_fffffffffffff880.i);
                  }
                }
                bVar1 = QHash<QGesture_*,_QGraphicsObject_*>::contains
                                  ((QHash<QGesture_*,_QGraphicsObject_*> *)
                                   CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
                                   (QGesture **)
                                   CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
                if ((!bVar1) &&
                   (bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsObject> *)0x9d07ae)
                   , bVar1)) {
                  local_338 = QPointer<QGraphicsObject>::data((QPointer<QGraphicsObject> *)0x9d07d7)
                  ;
                  QHash<QGesture_*,_QGraphicsObject_*>::insert
                            ((QHash<QGesture_*,_QGraphicsObject_*> *)
                             CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                             (QGesture **)in_stack_fffffffffffff868,(QGraphicsObject **)0x9d07fc);
                }
                QSet<QGesture_*>::const_iterator::operator++
                          ((const_iterator *)
                           CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
              }
              bVar1 = QSet<QGesture_*>::isEmpty((QSet<QGesture_*> *)0x9d082d);
              if (bVar1) {
                local_5f8 = 4;
              }
              else {
                local_5f8 = 0;
              }
              QGestureEvent::~QGestureEvent
                        ((QGestureEvent *)
                         CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
            }
            QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x9d0865);
            QPointer<QGraphicsObject>::~QPointer((QPointer<QGraphicsObject> *)0x9d0872);
            if ((local_5f8 != 0) && (local_5f8 == 4)) break;
          }
        }
        bVar1 = QSet<QGesture_*>::isEmpty((QSet<QGesture_*> *)0x9d08bd);
        if (!bVar1) {
          local_634 = 0;
          while( true ) {
            qVar11 = QList<QGraphicsObject_*>::size((QList<QGraphicsObject_*> *)(in_RDI + 0x338));
            local_715 = 0;
            if (local_634 < qVar11) {
              bVar1 = QSet<QGesture_*>::isEmpty((QSet<QGesture_*> *)0x9d0914);
              local_715 = bVar1 ^ 0xff;
            }
            if ((local_715 & 1) == 0) break;
            ppQVar12 = QList<QGraphicsObject_*>::at
                                 ((QList<QGraphicsObject_*> *)
                                  CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                                  (qsizetype)in_stack_fffffffffffff868);
            local_340 = *ppQVar12;
            local_348 = &DAT_aaaaaaaaaaaaaaaa;
            QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::value
                      ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)in_stack_fffffffffffff888.i,
                       in_stack_fffffffffffff880.i);
            local_358 = &DAT_aaaaaaaaaaaaaaaa;
            local_350 = &DAT_aaaaaaaaaaaaaaaa;
            QSet<QGesture_*>::begin((QSet<QGesture_*> *)in_stack_fffffffffffff888.i);
            local_368 = &DAT_aaaaaaaaaaaaaaaa;
            local_360 = &DAT_aaaaaaaaaaaaaaaa;
            QSet<QGesture_*>::end((QSet<QGesture_*> *)in_stack_fffffffffffff888.i);
            while (bVar1 = QSet<QGesture_*>::const_iterator::operator!=
                                     ((const_iterator *)
                                      CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                                      (const_iterator *)in_stack_fffffffffffff868), bVar1) {
              ppQVar16 = QSet<QGesture_*>::const_iterator::operator*((const_iterator *)0x9d0a3a);
              local_370 = *ppQVar16;
              bVar1 = QHash<QGesture_*,_QGraphicsObject_*>::contains
                                ((QHash<QGesture_*,_QGraphicsObject_*> *)
                                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
                                 (QGesture **)
                                 CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
              if (!bVar1) {
                QHash<QGesture_*,_QGraphicsObject_*>::insert
                          ((QHash<QGesture_*,_QGraphicsObject_*> *)
                           CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                           (QGesture **)in_stack_fffffffffffff868,(QGraphicsObject **)0x9d0a89);
                QSet<QGesture_*>::remove(local_1e8,(char *)&local_370);
              }
              QSet<QGesture_*>::const_iterator::operator++
                        ((const_iterator *)
                         CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
            }
            QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x9d0acf);
            local_634 = local_634 + 1;
          }
        }
        QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x9d0af4);
        QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x9d0b01);
        local_5f8 = in_stack_fffffffffffff87c;
      }
      local_378.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
      QSet<QGesture_*>::QSet((QSet<QGesture_*> *)0x9d0b1d);
      local_380 = &DAT_aaaaaaaaaaaaaaaa;
      QSet<QGesture_*>::QSet((QSet<QGesture_*> *)0x9d0b39);
      local_388.i = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
      local_388 = QList<QGesture_*>::begin
                            ((QList<QGesture_*> *)
                             CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
      local_390.i = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
      local_390 = QList<QGesture_*>::end
                            ((QList<QGesture_*> *)
                             CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
      while( true ) {
        local_398 = local_390.i;
        bVar1 = QList<QGesture_*>::const_iterator::operator!=(&local_388,local_390);
        if (!bVar1) break;
        ppQVar16 = QList<QGesture_*>::const_iterator::operator*(&local_388);
        local_3a0 = *ppQVar16;
        local_3b0 = 0;
        local_3a8 = QHash<QGesture_*,_QGraphicsObject_*>::value
                              ((QHash<QGesture_*,_QGraphicsObject_*> *)
                               CONCAT44(local_5f8,in_stack_fffffffffffff878),
                               (QGesture **)
                               CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                               (QGraphicsObject **)in_stack_fffffffffffff868);
        if (local_3a8 != (QGraphicsObject *)0x0) {
          QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::operator[]
                    ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)in_stack_fffffffffffff880.i,
                     (QGraphicsObject **)CONCAT44(local_5f8,in_stack_fffffffffffff878));
          QSet<QGesture_*>::insert
                    ((QSet<QGesture_*> *)in_stack_fffffffffffff888.i,
                     (QGesture **)in_stack_fffffffffffff880.i);
          QList<QGraphicsObject_*>::append
                    ((QList<QGraphicsObject_*> *)0x9d0c80,(parameter_type)in_stack_fffffffffffff868)
          ;
          QSet<QGesture_*>::insert
                    ((QSet<QGesture_*> *)in_stack_fffffffffffff888.i,
                     (QGesture **)in_stack_fffffffffffff880.i);
          QGraphicsItem::d_func((QGraphicsItem *)0x9d0cae);
          local_3d4.super_QFlagsStorage<Qt::GestureFlag>.i =
               (QFlagsStorage<Qt::GestureFlag>)0xaaaaaaaa;
          local_3d8 = QGesture::gestureType((QGesture *)0x9d0ce3);
          memset(local_3dc,0,4);
          QFlags<Qt::GestureFlag>::QFlags((QFlags<Qt::GestureFlag> *)0x9d0d0b);
          local_3d4.super_QFlagsStorage<Qt::GestureFlag>.i =
               (QFlagsStorage<Qt::GestureFlag>)
               QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::value
                         ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                          in_stack_fffffffffffff880.i,
                          (GestureType *)CONCAT44(local_5f8,in_stack_fffffffffffff878),
                          (QFlags<Qt::GestureFlag> *)
                          CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
          local_3e0.super_QFlagsStorage<Qt::GestureFlag>.i =
               (QFlagsStorage<Qt::GestureFlag>)
               QFlags<Qt::GestureFlag>::operator&
                         ((QFlags<Qt::GestureFlag> *)
                          CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                          (GestureFlag)((ulong)in_stack_fffffffffffff868 >> 0x20));
          IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_3e0);
          if (IVar5 != 0) {
            QSet<QGesture_*>::insert
                      ((QSet<QGesture_*> *)in_stack_fffffffffffff888.i,
                       (QGesture **)in_stack_fffffffffffff880.i);
          }
        }
        QList<QGesture_*>::const_iterator::operator++(&local_388);
      }
      QList<QGraphicsObject_*>::begin
                ((QList<QGraphicsObject_*> *)
                 CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
      conflicts = QList<QGraphicsObject_*>::end
                            ((QList<QGraphicsObject_*> *)
                             CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
      std::
      sort<QList<QGraphicsObject*>::iterator,bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>
                (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
                 (_func_bool_QGraphicsItem_ptr_QGraphicsItem_ptr *)in_stack_fffffffffffff868);
      for (local_674 = 0;
          qVar11 = QList<QGraphicsObject_*>::size((QList<QGraphicsObject_*> *)(in_RDI + 0x338)),
          local_674 < qVar11; local_674 = local_674 + 1) {
        local_400 = &DAT_aaaaaaaaaaaaaaaa;
        local_3f8 = &DAT_aaaaaaaaaaaaaaaa;
        QList<QGraphicsObject_*>::at
                  ((QList<QGraphicsObject_*> *)
                   CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                   (qsizetype)in_stack_fffffffffffff868);
        QPointer<QGraphicsObject>::QPointer<void>
                  ((QPointer<QGraphicsObject> *)
                   CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                   (QGraphicsObject *)in_stack_fffffffffffff868);
        local_408 = &DAT_aaaaaaaaaaaaaaaa;
        local_420 = QPointer<QGraphicsObject>::data((QPointer<QGraphicsObject> *)0x9d0e96);
        QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::value
                  ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)in_stack_fffffffffffff888.i,
                   in_stack_fffffffffffff880.i);
        ::operator&((QSet<QGesture_*> *)in_stack_fffffffffffff888.i,
                    (QSet<QGesture_*> *)in_stack_fffffffffffff880.i);
        local_430 = QPointer<QGraphicsObject>::data((QPointer<QGraphicsObject> *)0x9d0ef5);
        QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::value
                  ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)in_stack_fffffffffffff888.i,
                   in_stack_fffffffffffff880.i);
        ::operator-((QSet<QGesture_*> *)CONCAT44(local_5f8,in_stack_fffffffffffff878),
                    (QSet<QGesture_*> *)
                    CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
        QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x9d0f41);
        QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x9d0f4e);
        QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x9d0f5b);
        bVar1 = QSet<QGesture_*>::isEmpty((QSet<QGesture_*> *)0x9d0f68);
        if (bVar1) {
          local_5f8 = 0x17;
        }
        else {
          first.i = (QGraphicsObject **)(in_RDI + 0x358);
          local_438 = QPointer<QGraphicsObject>::data((QPointer<QGraphicsObject> *)0x9d0f9e);
          QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::operator[]
                    ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)in_stack_fffffffffffff880.i,
                     (QGraphicsObject **)CONCAT44(local_5f8,in_stack_fffffffffffff878));
          QSet<QGesture_*>::operator+=
                    ((QSet<QGesture_*> *)
                     CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                     (QSet<QGesture_*> *)in_stack_fffffffffffff868);
          QPointer<QGraphicsObject>::data((QPointer<QGraphicsObject> *)0x9d0fd5);
          bVar1 = QGraphicsItem::isPanel((QGraphicsItem *)0x9d0fe1);
          memset(&local_478,0xaa,0x40);
          QSet<QGesture_*>::values((QSet<QGesture_*> *)in_stack_fffffffffffff880.i);
          QGestureEvent::QGestureEvent
                    ((QGestureEvent *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                     (QList<QGesture_*> *)in_stack_fffffffffffff868);
          QList<QGesture_*>::~QList((QList<QGesture_*> *)0x9d1038);
          pQVar8 = QGestureEvent::widget(in_RSI);
          QGestureEvent::setWidget(&local_478,pQVar8);
          pQVar13 = QPointer<QGraphicsObject>::data((QPointer<QGraphicsObject> *)0x9d1062);
          this_01 = (QGraphicsScenePrivate *)0x0;
          if (pQVar13 != (QGraphicsObject *)0x0) {
            this_01 = (QGraphicsScenePrivate *)&pQVar13->super_QGraphicsItem;
          }
          sendEvent(in_stack_fffffffffffff898,(QGraphicsItem *)in_stack_fffffffffffff890,
                    (QEvent *)in_stack_fffffffffffff888.i);
          local_498 = &DAT_aaaaaaaaaaaaaaaa;
          QSet<QGesture_*>::QSet((QSet<QGesture_*> *)0x9d10bb);
          local_4a8 = &DAT_aaaaaaaaaaaaaaaa;
          local_4a0 = &DAT_aaaaaaaaaaaaaaaa;
          QSet<QGesture_*>::begin((QSet<QGesture_*> *)in_stack_fffffffffffff888.i);
          local_4b8 = &DAT_aaaaaaaaaaaaaaaa;
          local_4b0 = &DAT_aaaaaaaaaaaaaaaa;
          QSet<QGesture_*>::end((QSet<QGesture_*> *)in_stack_fffffffffffff888.i);
          while (bVar2 = QSet<QGesture_*>::const_iterator::operator!=
                                   ((const_iterator *)
                                    CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                                    (const_iterator *)in_stack_fffffffffffff868), bVar2) {
            ppQVar16 = QSet<QGesture_*>::const_iterator::operator*((const_iterator *)0x9d116e);
            local_4c0 = *ppQVar16;
            bVar2 = QEvent::isAccepted(&local_478.super_QEvent);
            if ((bVar2) ||
               (bVar2 = QGestureEvent::isAccepted
                                  ((QGestureEvent *)in_stack_fffffffffffff880.i,
                                   (QGesture *)CONCAT44(local_5f8,in_stack_fffffffffffff878)), bVar2
               )) {
              bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsObject> *)0x9d1251);
              if ((bVar2) &&
                 (GVar7 = QGesture::state((QGesture *)0x9d1264), GVar7 == GestureStarted)) {
                in_stack_fffffffffffff890 =
                     QPointer<QGraphicsObject>::data((QPointer<QGraphicsObject> *)0x9d1276);
                ppQVar15 = QHash<QGesture_*,_QGraphicsObject_*>::operator[]
                                     (in_stack_fffffffffffff880.i,
                                      (QGesture **)CONCAT44(local_5f8,in_stack_fffffffffffff878));
                *ppQVar15 = in_stack_fffffffffffff890;
              }
              QSet<QGesture_*>::remove(&local_378,(char *)&local_4c0);
            }
            else {
              bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsObject> *)0x9d11b8);
              in_stack_fffffffffffff8a7 = false;
              if (bVar2) {
                in_stack_fffffffffffff898 =
                     (QGraphicsScenePrivate *)
                     QPointer<QGraphicsObject>::data((QPointer<QGraphicsObject> *)0x9d11d4);
                local_4c8 = 0;
                pQVar14 = (QGraphicsScenePrivate *)
                          QHash<QGesture_*,_QGraphicsObject_*>::value
                                    ((QHash<QGesture_*,_QGraphicsObject_*> *)
                                     CONCAT44(local_5f8,in_stack_fffffffffffff878),
                                     (QGesture **)
                                     CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                                     (QGraphicsObject **)in_stack_fffffffffffff868);
                in_stack_fffffffffffff8a7 = in_stack_fffffffffffff898 == pQVar14;
              }
              if ((bool)in_stack_fffffffffffff8a7 != false) {
                QSet<QGesture_*>::insert
                          ((QSet<QGesture_*> *)in_stack_fffffffffffff888.i,
                           (QGesture **)in_stack_fffffffffffff880.i);
              }
            }
            QSet<QGesture_*>::const_iterator::operator++
                      ((const_iterator *)
                       CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
          }
          bVar2 = QSet<QGesture_*>::isEmpty((QSet<QGesture_*> *)0x9d12d5);
          if (bVar2) {
            local_5f8 = 0x15;
          }
          else {
            bVar2 = QSet<QGesture_*>::isEmpty((QSet<QGesture_*> *)0x9d12f8);
            if ((bVar2) || (bVar1)) {
              local_5f8 = 0;
            }
            else {
              local_4e0 = &DAT_aaaaaaaaaaaaaaaa;
              QList<QGraphicsObject_*>::constBegin
                        ((QList<QGraphicsObject_*> *)
                         CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
              QList<QGraphicsObject_*>::constEnd
                        ((QList<QGraphicsObject_*> *)
                         CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
              last.i._7_1_ = in_stack_fffffffffffff8a7;
              last.i._0_7_ = in_stack_fffffffffffff8a0;
              QSet<QGraphicsObject_*>::QSet<QList<QGraphicsObject_*>::const_iterator,_true>
                        ((QSet<QGraphicsObject_*> *)
                         CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),first,last);
              bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsObject> *)0x9d137f);
              GVar18 = (GestureFlag)((ulong)first.i >> 0x20);
              if (bVar1) {
                local_4f0.i.i.d =
                     (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)&DAT_aaaaaaaaaaaaaaaa
                ;
                local_4f0.i.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
                QSet<QGesture_*>::begin((QSet<QGesture_*> *)in_stack_fffffffffffff888.i);
                while( true ) {
                  QSet<QGesture_*>::end((QSet<QGesture_*> *)in_stack_fffffffffffff888.i);
                  bVar1 = QSet<QGesture_*>::iterator::operator!=
                                    ((iterator *)
                                     CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                                     (iterator *)in_stack_fffffffffffff868);
                  GVar18 = (GestureFlag)((ulong)first.i >> 0x20);
                  if (!bVar1) break;
                  QSet<QGesture_*>::iterator::operator*((iterator *)0x9d13fb);
                  bVar1 = QSet<QGesture_*>::contains
                                    ((QSet<QGesture_*> *)
                                     CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                                     (QGesture **)in_stack_fffffffffffff868);
                  if (bVar1) {
                    ppQVar16 = QSet<QGesture_*>::iterator::operator*((iterator *)0x9d1421);
                    in_stack_fffffffffffffaf8 = *ppQVar16;
                    local_50c = QGesture::gestureType((QGesture *)0x9d1439);
                    in_stack_fffffffffffff880.i =
                         (QGraphicsObject **)
                         QPointer<QGraphicsObject>::data((QPointer<QGraphicsObject> *)0x9d144d);
                    in_stack_fffffffffffff888.i = (QGraphicsObject **)0x0;
                    local_698 = (QGraphicsItem *)in_stack_fffffffffffff888.i;
                    if ((QGestureEvent *)in_stack_fffffffffffff880.i != (QGestureEvent *)0x0) {
                      in_stack_fffffffffffff888.i =
                           (QGraphicsObject **)
                           &((QGestureEvent *)in_stack_fffffffffffff880.i)->m_gestures;
                      local_698 = (QGraphicsItem *)in_stack_fffffffffffff888.i;
                    }
                    while (local_698 != (QGraphicsItem *)0x0) {
                      local_518 = QGraphicsItem::toGraphicsObject
                                            ((QGraphicsItem *)
                                             CONCAT17(in_stack_fffffffffffff877,
                                                      in_stack_fffffffffffff870));
                      if (local_518 != (QGraphicsObject *)0x0) {
                        QGraphicsItem::d_func((QGraphicsItem *)0x9d14b9);
                        bVar1 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::contains
                                          ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                                           in_stack_fffffffffffff880.i,
                                           (GestureType *)
                                           CONCAT44(local_5f8,in_stack_fffffffffffff878));
                        if (bVar1) {
                          QSet<QGraphicsObject_*>::insert
                                    ((QSet<QGraphicsObject_*> *)in_stack_fffffffffffff888.i,
                                     in_stack_fffffffffffff880.i);
                          QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::operator[]
                                    ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)
                                     in_stack_fffffffffffff880.i,
                                     (QGraphicsObject **)
                                     CONCAT44(local_5f8,in_stack_fffffffffffff878));
                          QSet<QGesture_*>::insert
                                    ((QSet<QGesture_*> *)in_stack_fffffffffffff888.i,
                                     (QGesture **)in_stack_fffffffffffff880.i);
                        }
                      }
                      bVar1 = QGraphicsItem::isPanel((QGraphicsItem *)0x9d1536);
                      if (bVar1) break;
                      local_698 = QGraphicsItem::parentItem((QGraphicsItem *)0x9d154b);
                    }
                    QSet<QGesture_*>::const_iterator::const_iterator
                              ((const_iterator *)
                               CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                               (iterator *)in_stack_fffffffffffff868);
                    QSet<QGesture_*>::erase
                              ((QSet<QGesture_*> *)in_stack_fffffffffffff890,
                               (const_iterator *)in_stack_fffffffffffff888.i);
                    QSet<QGesture_*>::iterator::operator=(&local_4f0,local_548);
                  }
                  else {
                    QSet<QGesture_*>::iterator::operator++
                              ((iterator *)
                               CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
                  }
                }
              }
              in_stack_fffffffffffff868 = (QGestureEvent *)0x0;
              gestureTargetsAtHotSpots
                        (this_01,(QSet<QGesture_*> *)pQVar13,GVar18,
                         (QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)
                         CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
                         (QSet<QGraphicsObject_*> *)in_stack_fffffffffffff898,
                         (QSet<QGesture_*> *)in_stack_fffffffffffff890,
                         (QSet<QGesture_*> *)conflicts.i);
              QSet<QGraphicsObject_*>::values
                        ((QSet<QGraphicsObject_*> *)in_stack_fffffffffffff880.i);
              QList<QGraphicsObject_*>::operator=
                        ((QList<QGraphicsObject_*> *)
                         CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                         (QList<QGraphicsObject_*> *)in_stack_fffffffffffff868);
              QList<QGraphicsObject_*>::~QList((QList<QGraphicsObject_*> *)0x9d162f);
              QList<QGraphicsObject_*>::begin
                        ((QList<QGraphicsObject_*> *)
                         CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
              QList<QGraphicsObject_*>::end
                        ((QList<QGraphicsObject_*> *)
                         CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
              std::
              sort<QList<QGraphicsObject*>::iterator,bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>
                        (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
                         (_func_bool_QGraphicsItem_ptr_QGraphicsItem_ptr *)in_stack_fffffffffffff868
                        );
              local_674 = -1;
              local_5f8 = 0x17;
              QSet<QGraphicsObject_*>::~QSet((QSet<QGraphicsObject_*> *)0x9d16a6);
            }
          }
          QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x9d16c0);
          QGestureEvent::~QGestureEvent
                    ((QGestureEvent *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870))
          ;
        }
        QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x9d16da);
        QPointer<QGraphicsObject>::~QPointer((QPointer<QGraphicsObject> *)0x9d16e7);
        if ((local_5f8 != 0) && (local_5f8 == 0x15)) break;
      }
      local_580 = &DAT_aaaaaaaaaaaaaaaa;
      local_578 = &DAT_aaaaaaaaaaaaaaaa;
      QSet<QGesture_*>::begin((QSet<QGesture_*> *)in_stack_fffffffffffff888.i);
      local_590 = &DAT_aaaaaaaaaaaaaaaa;
      local_588 = &DAT_aaaaaaaaaaaaaaaa;
      QSet<QGesture_*>::end((QSet<QGesture_*> *)in_stack_fffffffffffff888.i);
      while (bVar1 = QSet<QGesture_*>::const_iterator::operator!=
                               ((const_iterator *)
                                CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                                (const_iterator *)in_stack_fffffffffffff868), bVar1) {
        QSet<QGesture_*>::const_iterator::operator*((const_iterator *)0x9d17cd);
        GVar6 = QGesture::gestureCancelPolicy
                          ((QGesture *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870)
                          );
        if (GVar6 == CancelAllInContext) {
          cancelGesturesForChildren(in_stack_fffffffffffff940,in_stack_fffffffffffffaf8);
        }
        QSet<QGesture_*>::const_iterator::operator++
                  ((const_iterator *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
      }
      local_598.i = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
      local_598 = QList<QGesture_*>::begin
                            ((QList<QGesture_*> *)
                             CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
      local_5a0.i = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
      local_5a0 = QList<QGesture_*>::end
                            ((QList<QGesture_*> *)
                             CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
      while( true ) {
        local_5a8 = local_5a0.i;
        bVar1 = QList<QGesture_*>::const_iterator::operator!=(&local_598,local_5a0);
        if (!bVar1) break;
        ppQVar16 = QList<QGesture_*>::const_iterator::operator*(&local_598);
        local_5b0 = *ppQVar16;
        GVar7 = QGesture::state((QGesture *)0x9d18ca);
        if (GVar7 == GestureFinished || GVar7 == GestureCanceled) {
          QHash<QGesture_*,_QGraphicsObject_*>::remove
                    ((QHash<QGesture_*,_QGraphicsObject_*> *)(in_RDI + 0x360),(char *)&local_5b0);
        }
        QList<QGesture_*>::const_iterator::operator++(&local_598);
      }
      QList<QGraphicsObject_*>::clear
                ((QList<QGraphicsObject_*> *)
                 CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
      QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::clear
                ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)
                 CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
      QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::clear
                ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)
                 CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
      QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x9d1951);
      QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x9d195e);
      QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x9d196b);
      QList<QGesture_*>::~QList((QList<QGesture_*> *)0x9d1978);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::gestureEventHandler(QGestureEvent *event)
{
    QWidget *viewport = event->widget();
    if (!viewport)
        return;
    QGraphicsView *graphicsView = qobject_cast<QGraphicsView *>(viewport->parent());
    if (!graphicsView)
        return;

    const QList<QGesture *> allGestures = event->gestures();
    DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
            << "Gestures:" <<  allGestures;

    QSet<QGesture *> startedGestures;
    QPoint delta = viewport->mapFromGlobal(QPoint());
    QTransform toScene = QTransform::fromTranslate(delta.x(), delta.y())
                         * graphicsView->viewportTransform().inverted();
    for (QGesture *gesture : allGestures) {
        // cache scene coordinates of the hot spot
        if (gesture->hasHotSpot()) {
            gesture->d_func()->sceneHotSpot = toScene.map(gesture->hotSpot());
        } else {
            gesture->d_func()->sceneHotSpot = QPointF();
        }

        QGraphicsObject *target = gestureTargets.value(gesture, 0);
        if (!target) {
            // when we are not in started mode but don't have a target
            // then the only one interested in gesture is the view/scene
            if (gesture->state() == Qt::GestureStarted)
                startedGestures.insert(gesture);
        }
    }

    if (!startedGestures.isEmpty()) {
        QSet<QGesture *> normalGestures; // that have just one target
        QSet<QGesture *> conflictedGestures; // that have multiple possible targets
        gestureTargetsAtHotSpots(startedGestures, Qt::GestureFlag(0), &cachedItemGestures, nullptr,
                                 &normalGestures, &conflictedGestures);
        cachedTargetItems = cachedItemGestures.keys();
        std::sort(cachedTargetItems.begin(), cachedTargetItems.end(), qt_closestItemFirst);
        DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                << "Normal gestures:" << normalGestures
                << "Conflicting gestures:" << conflictedGestures;

        // deliver conflicted gestures as override events AND remember
        // initial gesture targets
        if (!conflictedGestures.isEmpty()) {
            for (int i = 0; i < cachedTargetItems.size(); ++i) {
                QPointer<QGraphicsObject> item = cachedTargetItems.at(i);

                // get gestures to deliver to the current item
                const QSet<QGesture *> gestures = conflictedGestures & cachedItemGestures.value(item.data());
                if (gestures.isEmpty())
                    continue;

                DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                        << "delivering override to"
                        << item.data() << gestures;
                // send gesture override
                QGestureEvent ev(gestures.values());
                ev.t = QEvent::GestureOverride;
                ev.setWidget(event->widget());
                // mark event and individual gestures as ignored
                ev.ignore();
                for (QGesture *g : gestures)
                    ev.setAccepted(g, false);
                sendEvent(item.data(), &ev);
                // mark all accepted gestures to deliver them as normal gesture events
                for (QGesture *g : gestures) {
                    if (ev.isAccepted() || ev.isAccepted(g)) {
                        conflictedGestures.remove(g);
                        // mark the item as a gesture target
                        if (item) {
                            gestureTargets.insert(g, item.data());
                            QHash<QGraphicsObject *, QSet<QGesture *> >::iterator it, e;
                            it = cachedItemGestures.begin();
                            e = cachedItemGestures.end();
                            for(; it != e; ++it)
                                it.value().remove(g);
                            cachedItemGestures[item.data()].insert(g);
                        }
                        DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                                << "override was accepted:"
                                << g << item.data();
                    }
                    // remember the first item that received the override event
                    // as it most likely become a target if no one else accepts
                    // the override event
                    if (!gestureTargets.contains(g) && item)
                        gestureTargets.insert(g, item.data());

                }
                if (conflictedGestures.isEmpty())
                    break;
            }
        }
        // remember the initial target item for each gesture that was not in
        // the conflicted state.
        if (!normalGestures.isEmpty()) {
            for (int i = 0; i < cachedTargetItems.size() && !normalGestures.isEmpty(); ++i) {
                QGraphicsObject *item = cachedTargetItems.at(i);

                // get gestures to deliver to the current item
                const auto gestures = cachedItemGestures.value(item);
                for (QGesture *g : gestures) {
                    if (!gestureTargets.contains(g)) {
                        gestureTargets.insert(g, item);
                        normalGestures.remove(g);
                    }
                }
            }
        }
    }


    // deliver all gesture events
    QSet<QGesture *> undeliveredGestures;
    QSet<QGesture *> parentPropagatedGestures;
    for (QGesture *gesture : allGestures) {
        if (QGraphicsObject *target = gestureTargets.value(gesture, 0)) {
            cachedItemGestures[target].insert(gesture);
            cachedTargetItems.append(target);
            undeliveredGestures.insert(gesture);
            QGraphicsItemPrivate *d = target->QGraphicsItem::d_func();
            const Qt::GestureFlags flags = d->gestureContext.value(gesture->gestureType());
            if (flags & Qt::IgnoredGesturesPropagateToParent)
                parentPropagatedGestures.insert(gesture);
        } else {
            DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                    << "no target for" << gesture << "at"
                    << gesture->hotSpot() << gesture->d_func()->sceneHotSpot;
        }
    }
    std::sort(cachedTargetItems.begin(), cachedTargetItems.end(), qt_closestItemFirst);
    for (int i = 0; i < cachedTargetItems.size(); ++i) {
        QPointer<QGraphicsObject> receiver = cachedTargetItems.at(i);
        const QSet<QGesture *> gestures = (undeliveredGestures
                                        & cachedItemGestures.value(receiver.data()))
                                        - cachedAlreadyDeliveredGestures.value(receiver.data());

        if (gestures.isEmpty())
            continue;

        cachedAlreadyDeliveredGestures[receiver.data()] += gestures;
        const bool isPanel = receiver.data()->isPanel();

        DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                << "delivering to"
                << receiver.data() << gestures;
        QGestureEvent ev(gestures.values());
        ev.setWidget(event->widget());
        sendEvent(receiver.data(), &ev);
        QSet<QGesture *> ignoredGestures;
        for (QGesture *g : gestures) {
            if (!ev.isAccepted() && !ev.isAccepted(g)) {
                // if the gesture was ignored by its target, we will update the
                // targetItems list with a possible target items (items that
                // want to receive partial gestures).
                // ### won't work if the target was destroyed in the event
                //     we will just stop delivering it.
                if (receiver && receiver.data() == gestureTargets.value(g, 0))
                    ignoredGestures.insert(g);
            } else {
                if (receiver && g->state() == Qt::GestureStarted) {
                    // someone accepted the propagated initial GestureStarted
                    // event, let it be the new target for all following events.
                    gestureTargets[g] = receiver.data();
                }
                undeliveredGestures.remove(g);
            }
        }
        if (undeliveredGestures.isEmpty())
            break;

        // ignoredGestures list is only filled when delivering to the gesture
        // target item, so it is safe to assume item == target.
        if (!ignoredGestures.isEmpty() && !isPanel) {
            // look for new potential targets for gestures that were ignored
            // and should be propagated.

            QSet<QGraphicsObject *> targetsSet(cachedTargetItems.constBegin(), cachedTargetItems.constEnd());

            if (receiver) {
                // first if the gesture should be propagated to parents only
                for (QSet<QGesture *>::iterator it = ignoredGestures.begin();
                     it != ignoredGestures.end();) {
                    if (parentPropagatedGestures.contains(*it)) {
                        QGesture *gesture = *it;
                        const Qt::GestureType gestureType = gesture->gestureType();
                        QGraphicsItem *item = receiver.data();
                        while (item) {
                            if (QGraphicsObject *obj = item->toGraphicsObject()) {
                                if (item->d_func()->gestureContext.contains(gestureType)) {
                                    targetsSet.insert(obj);
                                    cachedItemGestures[obj].insert(gesture);
                                }
                            }
                            if (item->isPanel())
                                break;
                            item = item->parentItem();
                        }

                        it = ignoredGestures.erase(it);
                        continue;
                    }
                    ++it;
                }
            }

            gestureTargetsAtHotSpots(ignoredGestures, Qt::ReceivePartialGestures,
                                     &cachedItemGestures, &targetsSet, nullptr, nullptr);

            cachedTargetItems = targetsSet.values();
            std::sort(cachedTargetItems.begin(), cachedTargetItems.end(), qt_closestItemFirst);
            DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                    << "new targets:" << cachedTargetItems;
            i = -1; // start delivery again
            continue;
        }
    }

    for (QGesture *g : std::as_const(startedGestures)) {
        if (g->gestureCancelPolicy() == QGesture::CancelAllInContext) {
            DEBUG() << "lets try to cancel some";
            // find gestures in context in Qt::GestureStarted or Qt::GestureUpdated state and cancel them
            cancelGesturesForChildren(g);
        }
    }

    // forget about targets for gestures that have ended
    for (QGesture *g : allGestures) {
        switch (g->state()) {
        case Qt::GestureFinished:
        case Qt::GestureCanceled:
            gestureTargets.remove(g);
            break;
        default:
            break;
        }
    }

    cachedTargetItems.clear();
    cachedItemGestures.clear();
    cachedAlreadyDeliveredGestures.clear();
}